

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcException.h
# Opt level: O2

void __thiscall
XmlRpc::XmlRpcException::XmlRpcException(XmlRpcException *this,XmlRpcException *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->_code = param_1->_code;
  return;
}

Assistant:

class XMLRPCPP_DECL XmlRpcException {
  public:
    //! Constructor
    //!   @param message  A descriptive error message
    //!   @param code     An integer error code
    XmlRpcException(const std::string& message, int code=-1) :
        _message(message), _code(code) {}

    //! Return the error message.
    const std::string& getMessage() const { return _message; }

    //! Return the error code.
    int getCode() const { return _code; }

  private:
    std::string _message;
    int _code;
  }